

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.h
# Opt level: O0

int __thiscall
asl::Map<asl::String,_asl::String>::indexOf(Map<asl::String,_asl::String> *this,String *key)

{
  int iVar1;
  KeyVal *pKVar2;
  int local_3c;
  int local_2c;
  int cmp;
  int mid;
  int max;
  int min;
  String *key_local;
  Map<asl::String,_asl::String> *this_local;
  
  mid = 0;
  local_2c = length(this);
  local_2c = local_2c + -1;
  iVar1 = length(this);
  cmp = local_2c;
  if (iVar1 == 0) {
    this_local._4_4_ = -1;
  }
  else {
    do {
      pKVar2 = Array<asl::Map<asl::String,_asl::String>::KeyVal>::operator[](&this->a,local_2c);
      iVar1 = compare(&pKVar2->key,key);
      if (iVar1 < 0) {
        mid = local_2c;
      }
      else {
        if (iVar1 < 1) {
          return local_2c;
        }
        cmp = local_2c;
      }
      local_2c = cmp + mid >> 1;
    } while (1 < cmp - mid);
    if (mid == cmp) {
      if (iVar1 < 0) {
        local_3c = -2 - cmp;
      }
      else {
        local_3c = -1;
      }
      this_local._4_4_ = local_3c;
    }
    else {
      pKVar2 = Array<asl::Map<asl::String,_asl::String>::KeyVal>::operator[](&this->a,mid);
      iVar1 = compare(&pKVar2->key,key);
      if (iVar1 == 0) {
        this_local._4_4_ = mid;
      }
      else if (iVar1 < 0) {
        this_local._4_4_ = -1 - cmp;
      }
      else {
        this_local._4_4_ = -1 - mid;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int Map<K,T>::indexOf(const K& key) const
{
	int min=0, max=(length()-1), mid=max, cmp;
	if(length()==0)
		return -1;
	do
	{
		cmp = compare(a[mid].key, key);
		if(cmp < 0) min = mid;
		else if(cmp > 0) max = mid;
		else return mid;
		mid = (max+min) >> 1;
	}
	while(max-min > 1);
	if(min == max)
		return (cmp < 0)? -max-2 : -1;
	cmp = compare(a[min].key, key);
	if(cmp == 0) return min;
	else if(cmp < 0) return -max-1;
	else return -min-1;
}